

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  undefined8 *in_RSI;
  int in_EDI;
  Paraglob p_2;
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_2;
  overflow_error *e;
  Paraglob sp;
  Paraglob p_1;
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  Paraglob p;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  double elapsed;
  char *c;
  char *b;
  char *a;
  double max_time;
  Paraglob *in_stack_fffffffffffffc28;
  value_type *__x;
  Paraglob *in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc3f;
  ostream *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffc58;
  Paraglob *in_stack_fffffffffffffc60;
  Paraglob *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_370 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcb8;
  Paraglob *in_stack_fffffffffffffcc0;
  allocator<char> local_2d9;
  string local_2d8 [8];
  string *in_stack_fffffffffffffd30;
  Paraglob *in_stack_fffffffffffffd38;
  int local_2b4;
  allocator<char> local_1a1;
  string local_1a0 [8];
  Paraglob *in_stack_fffffffffffffe68;
  int local_17c;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118 [6];
  allocator<char> local_79;
  string local_78 [36];
  int local_54;
  double local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  double local_18;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 0.0;
  local_10 = in_RSI;
  if (1 < in_EDI) {
    local_8 = in_EDI;
    iVar2 = strcmp((char *)in_RSI[1],"-b");
    if (iVar2 == 0) {
      if (local_8 == 6) {
        local_18 = atof((char *)local_10[5]);
      }
      local_20 = local_10[2];
      local_28 = local_10[3];
      local_30 = local_10[4];
      local_38 = benchmark((char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                           in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
                           (bool)in_stack_fffffffffffffc3f);
      if (0.0 < local_18) {
        if (local_18 < local_38) {
          std::operator<<((ostream *)&std::cout,"Failed.\n");
        }
        else {
          std::operator<<((ostream *)&std::cout,"Passed.\n");
        }
      }
    }
    else {
      iVar2 = strcmp((char *)local_10[1],"-n");
      if (iVar2 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x103ad6);
        for (local_54 = 3; local_54 < local_8; local_54 = local_54 + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                     (allocator<char> *)in_stack_fffffffffffffc60);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffc30,(value_type *)in_stack_fffffffffffffc28);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator(&local_79);
        }
        paraglob::Paraglob::Paraglob(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10[2];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_stack_fffffffffffffc68,
                   (allocator<char> *)in_stack_fffffffffffffc60);
        paraglob::Paraglob::get(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_118);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar4);
        std::operator<<(poVar3,"\n");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc40);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator(&local_139);
        paraglob::Paraglob::str_abi_cxx11_(in_stack_fffffffffffffe68);
        std::operator<<((ostream *)&std::cout,local_160);
        std::__cxx11::string::~string(local_160);
        paraglob::Paraglob::~Paraglob(in_stack_fffffffffffffc30);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc40);
      }
      else {
        iVar2 = strcmp((char *)local_10[1],"-s");
        if (iVar2 == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x103df7);
          for (local_17c = 3; local_17c < local_8; local_17c = local_17c + 1) {
            in_stack_fffffffffffffc58 =
                 (unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_10[local_17c];
            in_stack_fffffffffffffc60 = (Paraglob *)&local_1a1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                       (allocator<char> *)in_stack_fffffffffffffc60);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc30,(value_type *)in_stack_fffffffffffffc28);
            std::__cxx11::string::~string(local_1a0);
            std::allocator<char>::~allocator(&local_1a1);
          }
          paraglob::Paraglob::Paraglob(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          paraglob::Paraglob::serialize(in_stack_fffffffffffffc68);
          paraglob::Paraglob::Paraglob(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          std::
          unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_fffffffffffffc40);
          bVar1 = paraglob::Paraglob::operator==
                            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"passed");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else {
            in_stack_fffffffffffffc40 = std::operator<<((ostream *)&std::cout,"failed");
            std::ostream::operator<<
                      (in_stack_fffffffffffffc40,std::endl<char,std::char_traits<char>>);
          }
          paraglob::Paraglob::~Paraglob(in_stack_fffffffffffffc30);
          paraglob::Paraglob::~Paraglob(in_stack_fffffffffffffc30);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc40);
        }
        else {
          iVar2 = strcmp((char *)local_10[1],"-str");
          if (iVar2 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x104155);
            for (local_2b4 = 3; local_2b4 < local_8; local_2b4 = local_2b4 + 1) {
              __x = (value_type *)local_10[local_2b4];
              in_stack_fffffffffffffc30 = (Paraglob *)&local_2d9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                         (allocator<char> *)in_stack_fffffffffffffc60);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffc30,__x);
              std::__cxx11::string::~string(local_2d8);
              std::allocator<char>::~allocator(&local_2d9);
            }
            paraglob::Paraglob::Paraglob(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
            paraglob::Paraglob::str_abi_cxx11_(in_stack_fffffffffffffe68);
            std::operator<<((ostream *)&std::cout,local_370);
            std::__cxx11::string::~string(local_370);
            paraglob::Paraglob::~Paraglob(in_stack_fffffffffffffc30);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffc40);
          }
          else {
            std::operator<<((ostream *)&std::cout,"Unrecognized first param\n");
          }
        }
      }
    }
    return local_4;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"usage: ");
  poVar3 = std::operator<<(poVar3,(char *)*local_10);
  std::operator<<(poVar3," -n <text> <patterns>\n");
  poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
  std::operator<<(poVar3,"Prints the number of patterns that match the text.\n");
  poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
  poVar3 = std::operator<<(poVar3,(char *)*local_10);
  std::operator<<(poVar3," -b <a> <b> <c> <time>\n");
  poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
  std::operator<<(poVar3,"Benchmark. a - n patterns. b - n queries. c - % matches.\n");
  poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
  poVar3 = std::operator<<(poVar3,(char *)*local_10);
  std::operator<<(poVar3," -s <patterns>\n");
  poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
  std::operator<<(poVar3,"Prints a a paraglob with **patterns** serialization\n");
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
	double max_time = 0;

	if (argc <= 1) {
		std::cerr << "usage: " << argv[0] << " -n <text> <patterns>\n";
		std::cerr << "       " <<
			"Prints the number of patterns that match the text.\n";
		std::cerr << "       " << argv[0] << " -b <a> <b> <c> <time>\n";
		std::cerr << "       " <<
			"Benchmark. a - n patterns. b - n queries. c - % matches.\n";
		std::cerr << "       " << argv[0] << " -s <patterns>\n";
		std::cerr << "       " <<
			"Prints a a paraglob with **patterns** serialization\n";
		exit(1);
	}

	if (strcmp(argv[1], "-b") == 0) {
		if (argc == 6) {
			// there is a time argument
			max_time = atof(argv[5]);
		}

		char* a = argv[2];
		char* b = argv[3];
		char* c = argv[4];
		double elapsed = benchmark(a, b, c, max_time);

		if (max_time > 0) {
			if (elapsed <= max_time) {
				std::cout << "Passed.\n";
			} else {
				std::cout << "Failed.\n";
			}
		}
	} else if (strcmp(argv[1], "-n") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		paraglob::Paraglob p(v);
		std::cout << p.get(std::string(argv[2])).size() << "\n";
		std::cout << p.str();
	} else if (strcmp(argv[1], "-s") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		try
			{
			paraglob::Paraglob p(v);
			paraglob::Paraglob sp(p.serialize());
			if (p == sp)
				std::cout << "passed" << std::endl;
			else
				std::cout << "failed" << std::endl;
			}
		catch(const paraglob::overflow_error &e)
			{
			std::cerr << e.what() << '\n';
			}
	}
	else if (strcmp(argv[1], "-str") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		paraglob::Paraglob p(v);
		std::cout << p.str();
	}
	else {
		std::cout << "Unrecognized first param\n";
	}
}